

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

string * __thiscall
bssl::(anonymous_namespace)::CipherListToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,SSL_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  OPENSSL_STACK *sk;
  string *psVar3;
  SSL_CIPHER *c;
  size_t i;
  string *i_00;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sk = (OPENSSL_STACK *)SSL_CTX_get_ciphers((SSL_CTX *)this);
  i_00 = (string *)0x0;
  bVar1 = false;
  while( true ) {
    psVar3 = (string *)OPENSSL_sk_num(sk);
    if (psVar3 <= i_00) break;
    c = (SSL_CIPHER *)OPENSSL_sk_value(sk,(size_t)i_00);
    if (!bVar1) {
      iVar2 = SSL_CTX_cipher_in_group((SSL_CTX *)this,(size_t)i_00);
      if (iVar2 != 0) {
        bVar1 = true;
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if (bVar1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    SSL_CIPHER_get_name(c);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if (bVar1) {
      iVar2 = SSL_CTX_cipher_in_group((SSL_CTX *)this,(size_t)i_00);
      if (iVar2 == 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        bVar1 = false;
      }
    }
    i_00 = (string *)((long)&(i_00->_M_dataplus)._M_p + 1);
  }
  return psVar3;
}

Assistant:

static std::string CipherListToString(SSL_CTX *ctx) {
  bool in_group = false;
  std::string ret;
  const STACK_OF(SSL_CIPHER) *ciphers = SSL_CTX_get_ciphers(ctx);
  for (size_t i = 0; i < sk_SSL_CIPHER_num(ciphers); i++) {
    const SSL_CIPHER *cipher = sk_SSL_CIPHER_value(ciphers, i);
    if (!in_group && SSL_CTX_cipher_in_group(ctx, i)) {
      ret += "\t[\n";
      in_group = true;
    }
    ret += "\t";
    if (in_group) {
      ret += "  ";
    }
    ret += SSL_CIPHER_get_name(cipher);
    ret += "\n";
    if (in_group && !SSL_CTX_cipher_in_group(ctx, i)) {
      ret += "\t]\n";
      in_group = false;
    }
  }
  return ret;
}